

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

int mwTestBuf(mwData *mw,char *file,int line)

{
  int iVar1;
  void *pvVar2;
  char *p;
  int retv;
  int line_local;
  char *file_local;
  mwData *mw_local;
  
  p._0_4_ = 0;
  _retv = file;
  if (file == (char *)0x0) {
    _retv = "unknown";
  }
  iVar1 = mwIsSafeAddr(mw,mwDataSize + mwOverflowZoneSize);
  if (iVar1 == 0) {
    mwWrite("internal: <%ld> %s(%d): pointer MW-%p is invalid\n",mwCounter,_retv,(ulong)(uint)line,
            mw);
    mwIncErr();
    mw_local._4_4_ = 2;
  }
  else {
    if (mw->check != (mw->count ^ 0xfe0180U ^ mw->size ^ (long)mw->line)) {
      mwWrite("internal: <%ld> %s(%d), info trashed; relinking\n",mwCounter,_retv,(ulong)(uint)line)
      ;
      mwIncErr();
      iVar1 = mwRelink(mw,_retv,line);
      if (iVar1 == 0) {
        return 2;
      }
    }
    if ((mw->prev != (mwData *)0x0) && (mw->prev->next != mw)) {
      mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link1 broken\n",mwCounter,_retv,
              (ulong)(uint)line,mw->size,mw->count,mw->file,mw->line);
      mwIncErr();
      iVar1 = mwRelink(mw,_retv,line);
      if (iVar1 == 0) {
        p._0_4_ = 2;
      }
    }
    if ((mw->next != (mwData *)0x0) && (mw->next->prev != mw)) {
      mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link2 broken\n",mwCounter,_retv,
              (ulong)(uint)line,mw->size,mw->count,mw->file,mw->line);
      mwIncErr();
      iVar1 = mwRelink(mw,_retv,line);
      if (iVar1 == 0) {
        p._0_4_ = 2;
      }
    }
    pvVar2 = (void *)((long)&mw->prev + (long)mwDataSize);
    iVar1 = mwCheckOF(pvVar2);
    if (iVar1 != 0) {
      mwWrite("underflow: <%ld> %s(%d), %ld bytes alloc\'d at <%ld> %s(%d)\n",mwCounter,_retv,
              (ulong)(uint)line,mw->size,mw->count,mw->file,mw->line);
      mwIncErr();
      p._0_4_ = 1;
    }
    pvVar2 = (void *)((long)mwOverflowZoneSize + mw->size + (long)pvVar2);
    iVar1 = mwIsReadAddr(pvVar2,mwOverflowZoneSize);
    if ((iVar1 != 0) && (iVar1 = mwCheckOF(pvVar2), iVar1 != 0)) {
      mwWrite("overflow: <%ld> %s(%d), %ld bytes alloc\'d at <%ld> %s(%d)\n",mwCounter,_retv,
              (ulong)(uint)line,mw->size,mw->count,mw->file,mw->line);
      mwIncErr();
      p._0_4_ = 1;
    }
    mw_local._4_4_ = (int)p;
  }
  return mw_local._4_4_;
}

Assistant:

static int mwTestBuf(mwData *mw, const char *file, int line)
{
	int retv = 0;
	char *p;

	if (file == NULL) {
		file = "unknown";
	}

	if (!mwIsSafeAddr(mw, mwDataSize + mwOverflowZoneSize)) {
		mwWrite("internal: <%ld> %s(%d): pointer MW-%p is invalid\n",
				mwCounter, file, line, mw);
		mwIncErr();
		return 2;
	}

	if (mw->check != CHKVAL(mw)) {
		mwWrite("internal: <%ld> %s(%d), info trashed; relinking\n",
				mwCounter, file, line);
		mwIncErr();
		if (!mwRelink(mw, file, line)) {
			return 2;
		}
	}

	if (mw->prev && mw->prev->next != mw) {
		mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link1 broken\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		if (!mwRelink(mw, file, line)) {
			retv = 2;
		}
	}
	if (mw->next && mw->next->prev != mw) {
		mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link2 broken\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		if (!mwRelink(mw, file, line)) {
			retv = 2;
		}
	}

	p = ((char *)mw) + mwDataSize;
	if (mwCheckOF(p)) {
		mwWrite("underflow: <%ld> %s(%d), %ld bytes alloc'd at <%ld> %s(%d)\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		retv = 1;
	}
	p += mwOverflowZoneSize + mw->size;
	if (mwIsReadAddr(p, mwOverflowZoneSize) && mwCheckOF(p)) {
		mwWrite("overflow: <%ld> %s(%d), %ld bytes alloc'd at <%ld> %s(%d)\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		retv = 1;
	}

	return retv;
}